

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::RemoveLast
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  Type TVar7;
  MapFieldBase *this_00;
  LogMessage *pLVar8;
  ulong uVar9;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar6 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    ExtensionSet::RemoveLast
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
               *(int *)(field + 0x38));
    return;
  }
  TVar7 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4)) {
  case 1:
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = (ulong)uVar6;
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar9) < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
LAB_005c223f:
      LogMessage::~LogMessage(&local_58);
    }
    break;
  case 2:
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = (ulong)uVar6;
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar9) < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
      goto LAB_005c223f;
    }
    break;
  case 3:
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = (ulong)uVar6;
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar9) < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
      goto LAB_005c223f;
    }
    break;
  case 4:
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = (ulong)uVar6;
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar9) < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
      goto LAB_005c223f;
    }
    break;
  case 5:
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = (ulong)uVar6;
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar9) < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
      goto LAB_005c223f;
    }
    break;
  case 6:
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = (ulong)uVar6;
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar9) < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
      goto LAB_005c223f;
    }
    break;
  case 7:
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = (ulong)uVar6;
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar9) < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
      goto LAB_005c223f;
    }
    break;
  case 8:
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = (ulong)uVar6;
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar9) < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
      goto LAB_005c223f;
    }
    break;
  case 9:
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = (ulong)uVar6;
    if (*(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar9) < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x603);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
      LogMessage::~LogMessage(&local_58);
    }
    lVar3 = *(long *)((long)&message[2].super_MessageLite._vptr_MessageLite + uVar9);
    iVar2 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar9);
    *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar9) = iVar2 + -1;
    puVar4 = *(undefined8 **)(lVar3 + (long)iVar2 * 8);
    puVar4[1] = 0;
    *(undefined1 *)*puVar4 = 0;
    return;
  case 10:
    bVar5 = FieldDescriptor::is_map(field);
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6)
    ;
    if (bVar5) {
      this_00 = (MapFieldBase *)MapFieldBase::MutableRepeatedField(this_00);
      if (*(int *)&this_00->arena_ < 1) {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x603);
        pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
        LogFinisher::operator=(&local_59,pLVar8);
LAB_005c2326:
        LogMessage::~LogMessage(&local_58);
      }
    }
    else if (*(int *)&this_00->arena_ < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x603);
      pLVar8 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar8);
      goto LAB_005c2326;
    }
    iVar2 = *(int *)&this_00->arena_;
    *(int *)&this_00->arena_ = iVar2 + -1;
    (**(code **)(*((Rep *)this_00->repeated_field_)->elements[(long)iVar2 + -1] + 0x38))();
  default:
    goto switchD_005c1ee5_default;
  }
  piVar1 = (int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar9);
  *piVar1 = *piVar1 + -1;
switchD_005c1ee5_default:
  return;
}

Assistant:

void GeneratedMessageReflection::RemoveLast(
    Message* message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(RemoveLast);
  USAGE_CHECK_REPEATED(RemoveLast);

  if (field->is_extension()) {
    MutableExtensionSet(message)->RemoveLast(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)->RemoveLast();  \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<string> >(message, field)->RemoveLast();
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->RemoveLast<GenericTypeHandler<Message> >();
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->RemoveLast<GenericTypeHandler<Message> >();
        }
        break;
    }
  }
}